

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O3

DdNode * GetSingleOutputFunctionRemappedNewDD
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdManager **DdNew)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdManager *ddDestination;
  DdNode *pDVar6;
  uint numVars;
  DdManager *ddSource;
  long lVar7;
  DdNode **ppDVar8;
  uint uVar9;
  ulong uVar10;
  
  if (nOuts < 1) {
    iVar3 = 0;
  }
  else {
    uVar10 = 0;
    iVar3 = 0;
    do {
      pDVar4 = Cudd_Support(dd,pOutputs[uVar10]);
      Cudd_Ref(pDVar4);
      pDVar5 = dd->one;
      lVar7 = 0;
      if (pDVar4 != pDVar5) {
        piVar2 = dd->invperm;
        lVar7 = 0;
        pDVar6 = pDVar4;
        do {
          piVar1 = piVar2 + lVar7;
          lVar7 = lVar7 + 1;
          GetSingleOutputFunctionRemappedNewDD::Permute[pDVar6->index] = *piVar1;
          pDVar6 = (pDVar6->type).kids.T;
        } while (pDVar6 != pDVar5);
      }
      pDVar5 = Cudd_bddPermute(dd,pOutputs[uVar10],GetSingleOutputFunctionRemappedNewDD::Permute);
      GetSingleOutputFunctionRemappedNewDD::pRemapped[uVar10] = pDVar5;
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      if (iVar3 <= (int)lVar7) {
        iVar3 = (int)lVar7;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)nOuts);
  }
  uVar9 = 0x1f;
  if (nOuts - 1U != 0) {
    for (; nOuts - 1U >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) + 0x21;
  if ((uint)nOuts < 2) {
    uVar9 = nOuts;
  }
  if (uVar9 != 0) {
    ppDVar8 = GetSingleOutputFunctionRemappedNewDD::pbVarsEnc;
    uVar10 = 0;
    do {
      pDVar5 = Cudd_bddNewVarAtLevel(dd,(int)uVar10);
      *ppDVar8 = pDVar5;
      uVar10 = uVar10 + 1;
      ppDVar8 = ppDVar8 + 1;
    } while (uVar9 != uVar10);
  }
  pDVar5 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemappedNewDD::pRemapped,nOuts,
                      GetSingleOutputFunctionRemappedNewDD::pbVarsEnc,uVar9);
  Cudd_Ref(pDVar5);
  numVars = iVar3 + uVar9;
  if (numVars != 0 && SCARRY4(iVar3,uVar9) == (int)numVars < 0) {
    piVar2 = dd->invperm;
    uVar10 = 0;
    do {
      GetSingleOutputFunctionRemappedNewDD::Permute[piVar2[uVar10]] = (int)uVar10;
      uVar10 = uVar10 + 1;
    } while (numVars != uVar10);
  }
  ddDestination = Cudd_Init(numVars,0,0x100,0x40000,0);
  ddSource = dd;
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pDVar4 = Cudd_bddTransferPermute
                     (ddSource,ddDestination,pDVar5,GetSingleOutputFunctionRemappedNewDD::Permute);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,pDVar5);
  if (0 < nOuts) {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)
                              ((long)GetSingleOutputFunctionRemappedNewDD::pRemapped + lVar7));
      lVar7 = lVar7 + 8;
    } while ((ulong)(uint)nOuts << 3 != lVar7);
  }
  pDVar5 = Cudd_BddToAdd(ddDestination,pDVar4);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(ddDestination,pDVar4);
  *DdNew = ddDestination;
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * GetSingleOutputFunctionRemappedNewDD( DdManager * dd, DdNode ** pOutputs, int nOuts, DdManager ** DdNew )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    static DdNode * pbVarsEnc[MAXINPUTS];
    int nVarsEnc;

    DdManager * ddnew;

    DdNode * bSupp, * bTemp;
    int i, v, Counter;
    DdNode * bFunc;

    // these are in the new manager
    DdNode * bFuncNew;
    DdNode * aFuncNew;

    int nVarsMax = 0;

    // perform the remapping and write the DDs into the new manager
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        // to remap the DD into the upper part of the manager
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = dd->invperm[Counter++];

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );


        // determine the largest support size
        if ( nVarsMax < Counter )
            nVarsMax = Counter;
    }
    
    // select the encoding variables to follow immediately after the original variables
    nVarsEnc = Abc_Base2Log(nOuts);
/*
    for ( v = 0; v < nVarsEnc; v++ )
        if ( nVarsMax + v < dd->size )
            pbVarsEnc[v] = dd->var[ dd->invperm[nVarsMax+v] ];
        else
            pbVarsEnc[v] = Cudd_bddNewVar( dd );
*/
    // create the new variables on top of the manager
    for ( v = 0; v < nVarsEnc; v++ )
        pbVarsEnc[v] = Cudd_bddNewVarAtLevel( dd, v );

//fprintf( pTable, "%d ", Cudd_SharingSize( pRemapped, nOuts ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pRemapped, nOuts) );


    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );


    // find the cross-manager permutation
    // the variable from the level v in the old manager 
    // should become a variable number v in the new manager
    for ( v = 0; v < nVarsMax + nVarsEnc; v++ )
        Permute[dd->invperm[v]] = v;


    ///////////////////////////////////////////////////////////////////////////////
    // start the new manager
    ddnew = Cudd_Init( nVarsMax + nVarsEnc, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0);
//  Cudd_AutodynDisable(ddnew);
    Cudd_AutodynEnable(dd, CUDD_REORDER_SYMM_SIFT);

    // transfer it to the new manager
    bFuncNew = Cudd_bddTransferPermute( dd, ddnew, bFunc, Permute );      Cudd_Ref( bFuncNew );
    ///////////////////////////////////////////////////////////////////////////////


    // deref the intermediate results in the old manager
    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );


    ///////////////////////////////////////////////////////////////////////////////
    // convert to ADD in the new manager
    aFuncNew = Cudd_BddToAdd( ddnew, bFuncNew );  Cudd_Ref( aFuncNew );
    Cudd_RecursiveDeref( ddnew, bFuncNew );

    // return the manager
    *DdNew = ddnew;
    ///////////////////////////////////////////////////////////////////////////////

    Cudd_Deref( aFuncNew );
    return aFuncNew;
}